

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Derive.cpp
# Opt level: O2

void __thiscall chrono::ChFunction_Derive::ArchiveIN(ChFunction_Derive *this,ChArchiveIn *marchive)

{
  ChNameValue<int> local_48;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Derive>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_30._value = &this->fa;
  local_30._name = "fa";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->order;
  local_48._name = "order";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

void ChFunction_Derive::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Derive>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(fa);
    marchive >> CHNVP(order);
}